

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

void Geodesic::splitOnCommonEdge
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reference_leaf_num_map,vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_a,
               vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_b)

{
  PhyloTreeEdge *pPVar1;
  bool bVar2;
  long lVar3;
  size_type __n;
  size_type __n_00;
  long lVar4;
  PhyloTreeEdge *pPVar5;
  size_type sVar6;
  ulong i;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  size_t index;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  bool bVar7;
  size_t local_1b0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapA;
  string leaf_label;
  PhyloTreeEdge e;
  PhyloTreeEdge commonEdge;
  
  lVar4 = (long)(t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                _M_impl.super__Vector_impl_data._M_start;
  __n = lVar3 / 0x48;
  __n_00 = lVar4 / 0x48;
  if (lVar3 != 0 && lVar4 != 0) {
    leaf_label._M_dataplus._M_p = (pointer)&leaf_label.field_2;
    leaf_label._M_string_length = 0;
    leaf_label.field_2._M_local_buf[0] = '\0';
    PhyloTreeEdge::PhyloTreeEdge(&commonEdge);
    PhyloTree::getFirstCommonEdge
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,t1_edges,
               t2_edges);
    PhyloTreeEdge::operator=(&commonEdge,&e);
    PhyloTreeEdge::~PhyloTreeEdge(&e);
    leaf2NumMapA.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    leaf2NumMapA.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    leaf2NumMapA.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    leaf2NumMapB.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    leaf2NumMapB.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    leaf2NumMapB.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgesA1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgesA1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgesA1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgesA2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgesA2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgesA2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgesB1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgesB1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgesB1.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    edgesB2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    edgesB2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    edgesB2.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&edgesA1,__n);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&edgesA2,__n_00);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&edgesB1,__n);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve(&edgesB2,__n_00);
    pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar5 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                  _M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
      PhyloTreeEdge::PhyloTreeEdge(&e,pPVar5);
      Bipartition::clear(&e.super_Bipartition);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&edgesA1,&e);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&edgesB1,&e);
      PhyloTreeEdge::~PhyloTreeEdge(&e);
    }
    pPVar1 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar5 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                  _M_impl.super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
      PhyloTreeEdge::PhyloTreeEdge(&e,pPVar5);
      Bipartition::clear(&e.super_Bipartition);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&edgesA2,&e);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(&edgesB2,&e);
      PhyloTreeEdge::~PhyloTreeEdge(&e);
    }
    bVar7 = false;
    local_1b0 = 0;
    index = 0;
    for (i = 0; i < (ulong)((long)(reference_leaf_num_map->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(reference_leaf_num_map->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5); i = i + 1) {
      std::__cxx11::string::_M_assign((string *)&leaf_label);
      bVar2 = Bipartition::contains(&commonEdge.super_Bipartition,i);
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&leaf2NumMapA,&leaf_label);
        if (!bVar7) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                         &leaf_label,"*");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &leaf2NumMapB,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::__cxx11::string::~string((string *)&e);
          lVar3 = 0;
          sVar6 = __n;
          while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
            bVar7 = Bipartition::properlyContains
                              ((Bipartition *)
                               ((long)&(((t1_edges->
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar3),
                               &commonEdge.super_Bipartition);
            if (bVar7) {
              Bipartition::addOne((Bipartition *)
                                  ((long)&((edgesB1.
                                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_Bipartition)._vptr_Bipartition + lVar3),index);
            }
            lVar3 = lVar3 + 0x48;
          }
          lVar3 = 0;
          sVar6 = __n_00;
          while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
            bVar7 = Bipartition::properlyContains
                              ((Bipartition *)
                               ((long)&(((t2_edges->
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar3),
                               &commonEdge.super_Bipartition);
            if (bVar7) {
              Bipartition::addOne((Bipartition *)
                                  ((long)&((edgesB2.
                                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_Bipartition)._vptr_Bipartition + lVar3),index);
            }
            lVar3 = lVar3 + 0x48;
          }
          index = index + 1;
        }
        lVar3 = 0;
        sVar6 = __n;
        while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
          bVar7 = Bipartition::properlyContains
                            (&commonEdge.super_Bipartition,
                             (Bipartition *)
                             ((long)&(((t1_edges->
                                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_Bipartition)._vptr_Bipartition + lVar3));
          if (bVar7) {
            bVar7 = Bipartition::contains
                              ((Bipartition *)
                               ((long)&(((t1_edges->
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar3),i);
            if (bVar7) {
              Bipartition::addOne((Bipartition *)
                                  ((long)&((edgesA1.
                                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_Bipartition)._vptr_Bipartition + lVar3),local_1b0);
            }
          }
          lVar3 = lVar3 + 0x48;
        }
        lVar3 = 0;
        sVar6 = __n_00;
        while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
          bVar7 = Bipartition::properlyContains
                            (&commonEdge.super_Bipartition,
                             (Bipartition *)
                             ((long)&(((t2_edges->
                                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_Bipartition)._vptr_Bipartition + lVar3));
          if (bVar7) {
            bVar7 = Bipartition::contains
                              ((Bipartition *)
                               ((long)&(((t2_edges->
                                         super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->
                                       super_Bipartition)._vptr_Bipartition + lVar3),i);
            if (bVar7) {
              Bipartition::addOne((Bipartition *)
                                  ((long)&((edgesA2.
                                            super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_Bipartition)._vptr_Bipartition + lVar3),local_1b0);
            }
          }
          lVar3 = lVar3 + 0x48;
        }
        local_1b0 = local_1b0 + 1;
        bVar7 = true;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&leaf2NumMapB,&leaf_label);
        lVar3 = 0;
        sVar6 = __n;
        while (bVar2 = sVar6 != 0, sVar6 = sVar6 - 1, bVar2) {
          bVar2 = Bipartition::contains
                            ((Bipartition *)
                             ((long)&(((t1_edges->
                                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_Bipartition)._vptr_Bipartition + lVar3),i);
          if (bVar2) {
            Bipartition::addOne((Bipartition *)
                                ((long)&((edgesB1.
                                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_Bipartition)._vptr_Bipartition + lVar3),index);
          }
          lVar3 = lVar3 + 0x48;
        }
        lVar3 = 0;
        sVar6 = __n_00;
        while (bVar2 = sVar6 != 0, sVar6 = sVar6 - 1, bVar2) {
          bVar2 = Bipartition::contains
                            ((Bipartition *)
                             ((long)&(((t2_edges->
                                       super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super_Bipartition)._vptr_Bipartition + lVar3),i);
          if (bVar2) {
            Bipartition::addOne((Bipartition *)
                                ((long)&((edgesB2.
                                          super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_Bipartition)._vptr_Bipartition + lVar3),index);
          }
          lVar3 = lVar3 + 0x48;
        }
        index = index + 1;
      }
    }
    deleteEmptyEdges(&edgesA1);
    deleteEmptyEdges(&edgesA2);
    splitOnCommonEdge(&edgesA1,&edgesA2,&leaf2NumMapA,destination_a,destination_b);
    deleteEmptyEdges(&edgesB1);
    deleteEmptyEdges(&edgesB2);
    splitOnCommonEdge(&edgesB1,&edgesB2,&leaf2NumMapB,destination_a,destination_b);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&edgesB2);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&edgesB1);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&edgesA2);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&edgesA1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&leaf2NumMapB);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&leaf2NumMapA);
    PhyloTreeEdge::~PhyloTreeEdge(&commonEdge);
    std::__cxx11::string::~string((string *)&leaf_label);
  }
  return;
}

Assistant:

void Geodesic::splitOnCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges,
        vector<string> &reference_leaf_num_map, vector<PhyloTree> &destination_a, vector<PhyloTree> &destination_b) {
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); /// number of edges in tree 2
    if (numEdges1 == 0 || numEdges2 == 0) {
        return;
    }
    string leaf_label;
    // look for common edges
    PhyloTreeEdge commonEdge;
    try {
        commonEdge = PhyloTree::getFirstCommonEdge(t1_edges, t2_edges);
    }
    catch (edge_not_found_exception &err) {
        destination_a.reserve(destination_a.size() + numEdges1);
        destination_b.reserve(destination_b.size() + numEdges2);
        destination_a.emplace_back(t1_edges, reference_leaf_num_map);
        destination_b.emplace_back(t2_edges, reference_leaf_num_map);
        return;
    }

    // A will be the tree with leaves corresponding to 1's in commonEdge
    vector<string> leaf2NumMapA;
    vector<string> leaf2NumMapB;

    vector<PhyloTreeEdge> edgesA1;
    vector<PhyloTreeEdge> edgesA2;
    vector<PhyloTreeEdge> edgesB1;
    vector<PhyloTreeEdge> edgesB2;

    edgesA1.reserve(numEdges1);
    edgesA2.reserve(numEdges2);
    edgesB1.reserve(numEdges1);
    edgesB2.reserve(numEdges2);

    for (PhyloTreeEdge e : t1_edges) { // have to copy e <= DO NOT MAKE e A REFERENCE
        e.clear();
        edgesA1.push_back(e);
        edgesB1.push_back(e);
    }

    for (PhyloTreeEdge e : t2_edges) { // as above
        e.clear();
        edgesA2.push_back(e);
        edgesB2.push_back(e);
    }

    bool aLeavesAdded = false;  // if we have added a leaf in B representing the A tree
    size_t indexAleaves = 0;  // the index we are at in  the vectors holding the leaves in the A and B subtrees
    size_t indexBleaves = 0;

    // step through the leaves represented in commonEdge
    // (there should be two more leaves than edges)
    for (size_t i = 0; i < reference_leaf_num_map.size(); i++) {
        leaf_label = reference_leaf_num_map[i];
        if (commonEdge.contains(i)) {
            // commonEdge contains leaf i
            leaf2NumMapA.push_back(leaf_label);

            // these leaves must be added as a group to the B trees
            if (!aLeavesAdded) {
                leaf2NumMapB.push_back(leaf_label + "*");    // add a one of the leaves of the A tree to represent all the A trees leaves
                for (size_t j = 0; j < numEdges1; j++) {
                    if (t1_edges[j].properlyContains(commonEdge)) {
                        edgesB1[j].addOne(indexBleaves);
                    }
                }
                for (size_t j = 0; j < numEdges2; j++) {
                    if (t2_edges[j].properlyContains(commonEdge)) {
                        edgesB2[j].addOne(indexBleaves);
                    }
                }
                indexBleaves++;
                aLeavesAdded = true;
            }
            // add the column corresponding to this leaf to the A edges vector (for the corresponding trees)
            // XXX: problem: might be adding edges which contain leaves in A but also
            for (size_t j = 0; j < numEdges1; j++) {
                if (commonEdge.properlyContains(t1_edges[j]) && t1_edges[j].contains(i)) {
                    edgesA1[j].addOne(indexAleaves);
                }
            }
            for (size_t j = 0; j < numEdges2; j++) {
                if (commonEdge.properlyContains(t2_edges[j]) && t2_edges[j].contains(i)) {
                    edgesA2[j].addOne(indexAleaves);
                }
            }
            indexAleaves++;
        } else {
            // commonEdge does not contain leaf i
            leaf2NumMapB.push_back(leaf_label);
            for (int j = 0; j < numEdges1; j++) {
                if (t1_edges[j].contains(i)) {
                    edgesB1[j].addOne(indexBleaves);
                }
            }
            for (int j = 0; j < numEdges2; j++) {
                if (t2_edges[j].contains(i)) {
                    edgesB2[j].addOne(indexBleaves);
                }
            }
            indexBleaves++;
        }
    }

    deleteEmptyEdges(edgesA1);
    deleteEmptyEdges(edgesA2);
    splitOnCommonEdge(edgesA1, edgesA2, leaf2NumMapA, destination_a, destination_b);

    deleteEmptyEdges(edgesB1);
    deleteEmptyEdges(edgesB2);
    splitOnCommonEdge(edgesB1, edgesB2, leaf2NumMapB, destination_a, destination_b);
}